

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

void cpu_x86_cpuid_x86_64
               (CPUX86State *env,uint32_t index,uint32_t count,uint32_t *eax,uint32_t *ebx,
               uint32_t *ecx,uint32_t *edx)

{
  uint64_t uVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint32_t uVar6;
  unsigned_long uVar7;
  byte bVar8;
  int iVar9;
  uint32_t uVar10;
  uint32_t *puVar11;
  uint uVar12;
  uint32_t uVar13;
  ulong uVar14;
  uint uVar15;
  uint32_t uVar16;
  CPUCacheInfo *pCVar17;
  uint uVar18;
  int iVar19;
  X86CPUTopoInfo topo_info;
  X86CPUTopoInfo local_48;
  unsigned_long local_38;
  
  local_48.nodes_per_pkg = env->nr_nodes;
  local_48.dies_per_pkg = env->nr_dies;
  local_48.cores_per_die = (uint)env[-6].mtrr_var[4].base;
  local_48.threads_per_core = *(uint *)((long)&env[-6].mtrr_var[4].base + 4);
  if (index < 0xc0000000) {
    if ((int)index < 0) {
      uVar12 = env->cpuid_xlevel;
    }
    else {
      uVar12 = 0x40000001;
      if (index < 0x40000000) {
        uVar12 = env->cpuid_level;
      }
    }
  }
  else {
    uVar12 = env->cpuid_xlevel2;
  }
  if (uVar12 < index) {
    index = env->cpuid_level;
  }
  if ((int)index < 0) {
    if (-0x7fffffe3 < (int)index) {
      if ((int)index < -0x3ffffffe) {
        if (index == 0x8000001e) {
          if (0xff < *(int *)((long)&env[1].ldt.base + 4)) {
            __assert_fail("cpu->core_id <= 255",
                          "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                          ,0x114b,
                          "void cpu_x86_cpuid_x86_64(CPUX86State *, uint32_t, uint32_t, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                         );
          }
          uVar12 = local_48.nodes_per_pkg + (local_48.nodes_per_pkg == 0);
          local_38 = (unsigned_long)uVar12;
          if (local_48.threads_per_core != 0) {
            uVar5 = local_48.threads_per_core - 1;
            uVar15 = 0x1f;
            if (uVar5 != 0) {
              for (; uVar5 >> uVar15 == 0; uVar15 = uVar15 - 1) {
              }
            }
            iVar4 = (uVar15 ^ 0xffffffe0) + 0x21;
            if (uVar5 == 0) {
              iVar4 = 0;
            }
            if ((local_48.cores_per_die != 0) && (local_48.dies_per_pkg != 0)) {
              uVar5 = (uint)env[1].regs[2];
              uVar18 = local_48.cores_per_die - 1;
              uVar15 = 0x1f;
              if (uVar18 != 0) {
                for (; uVar18 >> uVar15 == 0; uVar15 = uVar15 - 1) {
                }
              }
              iVar9 = (uVar15 ^ 0xffffffe0) + 0x21;
              if (uVar18 == 0) {
                iVar9 = 0;
              }
              uVar18 = local_48.dies_per_pkg - 1;
              uVar15 = 0x1f;
              if (uVar18 != 0) {
                for (; uVar18 >> uVar15 == 0; uVar15 = uVar15 - 1) {
                }
              }
              iVar19 = (uVar15 ^ 0xffffffe0) + 0x21;
              if (uVar18 == 0) {
                iVar19 = 0;
              }
              uVar18 = iVar19 + iVar9 + iVar4;
              uVar15 = 3;
              if (3 < uVar18) {
                uVar15 = uVar18;
              }
              if (local_48.nodes_per_pkg == 0) {
                uVar15 = uVar18;
              }
              uVar18 = uVar12 - 1;
              iVar19 = 0x1f;
              if (uVar18 != 0) {
                for (; uVar18 >> iVar19 == 0; iVar19 = iVar19 + -1) {
                }
              }
              bVar8 = ((byte)iVar19 ^ 0xe0) + 0x21;
              if (uVar18 == 0) {
                bVar8 = 0;
              }
              *eax = uVar5;
              uVar18 = uVar5 >> (bVar8 + (byte)uVar15 & 0x1f);
              uVar15 = ~(uint)(0xffffffffL << (bVar8 & 0x3f)) & uVar5 >> ((byte)uVar15 & 0x1f);
              *ebx = uVar15 * 8 |
                     local_48.threads_per_core * 0x100 - 0x100 |
                     ~(uint)(0xffffffffL << ((byte)iVar9 & 0x3f)) & uVar5 >> ((byte)iVar4 & 0x1f);
              if (local_48.nodes_per_pkg < 5) {
                uVar18 = uVar18 << 2;
                uVar12 = uVar12 * 0x100 - 0x100;
              }
              else {
                local_38 = local_38 - 1;
                uVar7 = find_last_bit(&local_38,8);
                uVar18 = uVar18 << ((char)uVar7 + 1U & 0x1f);
                uVar12 = (int)local_38 << 8;
              }
              *ecx = uVar12 | uVar18 | uVar15;
              *edx = 0;
              return;
            }
          }
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/i386/topology.h"
                     ,0x43,"count >= 1");
        }
        if (index == 0xc0000000) {
          uVar6 = env->cpuid_xlevel2;
          goto LAB_0050c593;
        }
        if (index == 0xc0000001) {
          *eax = env->cpuid_version;
          *ebx = 0;
          *ecx = 0;
          uVar12 = (uint)env->features[10];
          goto LAB_0050c5a0;
        }
      }
      goto switchD_0050bd38_caseD_80000009;
    }
    switch(index) {
    case 0x80000000:
      uVar6 = env->cpuid_xlevel;
      goto LAB_0050c329;
    case 0x80000001:
      *eax = env->cpuid_version;
      *ebx = 0;
      *ecx = (uint32_t)env->features[7];
      *edx = (uint32_t)env->features[6];
      if (*(int *)((long)&env[-6].mtrr_var[4].base + 4) * (int)env[-6].mtrr_var[4].base < 2) {
        return;
      }
      if (((env->cpuid_vendor1 == 0x756e6547) && (env->cpuid_vendor2 == 0x49656e69)) &&
         (env->cpuid_vendor3 == 0x6c65746e)) {
        return;
      }
      *(byte *)ecx = (byte)*ecx | 2;
      return;
    case 0x80000002:
    case 0x80000003:
    case 0x80000004:
      *eax = env->cpuid_model[index * 4 - 8];
      *ebx = env->cpuid_model[index * 4 - 7];
      *ecx = env->cpuid_model[index * 4 - 6];
      uVar12 = env->cpuid_model[index * 4 - 5];
      goto LAB_0050c5a0;
    case 0x80000005:
      if (*(char *)((long)env[1].regs + 0x15) == '\x01') {
        puVar11 = (uint32_t *)cpuid(0x80000005);
        uVar6 = *puVar11;
        uVar16 = puVar11[1];
        uVar13 = puVar11[2];
        uVar10 = puVar11[3];
        goto LAB_0050c3dd;
      }
      *eax = 0x1ff01ff;
      *ebx = 0x1ff01ff;
      uVar6 = encode_cache_cpuid80000005((env->cache_info_amd).l1d_cache);
      *ecx = uVar6;
      uVar12 = encode_cache_cpuid80000005((env->cache_info_amd).l1i_cache);
      goto LAB_0050c5a0;
    case 0x80000006:
      if (*(char *)((long)env[1].regs + 0x15) != '\x01') {
        *eax = 0;
        *ebx = 0x42004200;
        if (*(char *)((long)&env[1].segs[5].base + 2) == '\x01') {
          pCVar17 = (env->cache_info_amd).l3_cache;
        }
        else {
          pCVar17 = (CPUCacheInfo *)0x0;
        }
        encode_cache_cpuid80000006((env->cache_info_amd).l2_cache,pCVar17,ecx,edx);
        return;
      }
      puVar11 = (uint32_t *)cpuid(0x80000006);
      uVar6 = *puVar11;
      uVar16 = puVar11[1];
      uVar13 = puVar11[2];
      uVar10 = puVar11[3];
LAB_0050c3dd:
      if (eax != (uint32_t *)0x0) {
        *eax = uVar6;
      }
      if (ebx != (uint32_t *)0x0) {
        *ebx = uVar16;
      }
      if (ecx != (uint32_t *)0x0) {
        *ecx = uVar10;
      }
      if (edx == (uint32_t *)0x0) {
        return;
      }
      *edx = uVar13;
      return;
    case 0x80000007:
      *eax = 0;
      *ebx = 0;
      *ecx = 0;
      uVar12 = (uint)env->features[8];
      goto LAB_0050c5a0;
    case 0x80000008:
      uVar1 = env->features[6];
      uVar12 = env[1].segs[5].flags;
      *eax = uVar12;
      if (((uint)uVar1 >> 0x1d & 1) != 0) {
        uVar5 = 0x3900;
        if (((uint)env->features[3] >> 0x10 & 1) == 0) {
          uVar5 = 0x3000;
        }
        *eax = uVar12 | uVar5;
      }
      *ebx = (uint32_t)env->features[9];
      *ecx = 0;
      *edx = 0;
      iVar4 = *(int *)((long)&env[-6].mtrr_var[4].base + 4) * (int)env[-6].mtrr_var[4].base;
      if (iVar4 < 2) {
        return;
      }
      *ecx = *ecx | iVar4 - 1U;
      return;
    case 0x80000009:
      break;
    case 0x8000000a:
      if ((env->features[7] & 4) != 0) {
        *eax = 1;
        *ebx = 0x10;
        *ecx = 0;
        uVar12 = (uint)env->features[0x12];
        goto LAB_0050c5a0;
      }
      break;
    default:
      if (index == 0x8000001d) {
        *eax = 0;
        if (*(char *)((long)env[1].regs + 0x15) == '\x01') {
          puVar11 = (uint32_t *)cpuid(0x8000001d);
          uVar6 = *puVar11;
          uVar16 = puVar11[1];
          uVar13 = puVar11[2];
          uVar10 = puVar11[3];
          goto LAB_0050c3dd;
        }
        switch(count) {
        case 0:
          pCVar17 = (env->cache_info_amd).l1d_cache;
          break;
        case 1:
          pCVar17 = (env->cache_info_amd).l1i_cache;
          break;
        case 2:
          pCVar17 = (env->cache_info_amd).l2_cache;
          break;
        case 3:
          pCVar17 = (env->cache_info_amd).l3_cache;
          break;
        default:
          goto switchD_0050c57f_default;
        }
        encode_cache_cpuid8000001d(pCVar17,&local_48,eax,ebx,ecx,edx);
        return;
      }
    }
    goto switchD_0050bd38_caseD_80000009;
  }
  switch(index) {
  case 0:
    uVar6 = env->cpuid_level;
LAB_0050c329:
    *eax = uVar6;
    *ebx = env->cpuid_vendor1;
    *edx = env->cpuid_vendor2;
    *ecx = env->cpuid_vendor3;
    break;
  case 1:
    *eax = env->cpuid_version;
    *ebx = (int)env[1].regs[2] << 0x18 | 0x800;
    uVar12 = (uint)env->features[1];
    *ecx = uVar12;
    if (((uVar12 >> 0x1a & 1) != 0) && ((*(byte *)((long)env->cr + 0x22) & 4) != 0)) {
      *ecx = uVar12 | 0x8000000;
    }
    *edx = (uint32_t)env->features[0];
    iVar4 = *(int *)((long)&env[-6].mtrr_var[4].base + 4) * (int)env[-6].mtrr_var[4].base;
    if (1 < iVar4) {
      *ebx = *ebx | iVar4 * 0x10000;
      *(byte *)((long)edx + 3) = *(byte *)((long)edx + 3) | 0x10;
    }
    break;
  case 2:
    if (*(char *)((long)env[1].regs + 0x15) == '\x01') {
      puVar11 = (uint32_t *)cpuid_cache_tlb_info(2);
      uVar6 = *puVar11;
      uVar16 = puVar11[1];
      uVar13 = puVar11[2];
      uVar10 = puVar11[3];
      goto LAB_0050c3dd;
    }
    *eax = 1;
    *ebx = 0;
    uVar12 = 0;
    if (*(char *)((long)&env[1].segs[5].base + 2) == '\x01') {
      bVar8 = cpuid2_cache_descriptor((env->cache_info_cpuid2).l3_cache);
      uVar12 = (uint)bVar8;
    }
    *ecx = uVar12;
    bVar8 = cpuid2_cache_descriptor((env->cache_info_cpuid2).l1d_cache);
    bVar2 = cpuid2_cache_descriptor((env->cache_info_cpuid2).l1i_cache);
    bVar3 = cpuid2_cache_descriptor((env->cache_info_cpuid2).l2_cache);
    uVar12 = (uint)bVar3 | (uint)bVar2 << 8 | (uint)bVar8 << 0x10;
    goto LAB_0050c5a0;
  case 3:
  case 8:
  case 9:
  case 10:
  case 0xc:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
    goto switchD_0050bd38_caseD_80000009;
  case 4:
    if (*(char *)((long)env[1].regs + 0x15) == '\x01') {
      puVar11 = (uint32_t *)cpuid_Deterministic_Cache_Parameters_info(4);
      uVar6 = puVar11[1];
      uVar16 = puVar11[2];
      uVar13 = puVar11[3];
      if (eax != (uint32_t *)0x0) {
        *eax = *puVar11;
      }
      if (ebx != (uint32_t *)0x0) {
        *ebx = uVar6;
      }
      if (ecx != (uint32_t *)0x0) {
        *ecx = uVar13;
      }
      if (edx != (uint32_t *)0x0) {
        *edx = uVar16;
      }
      uVar12 = *eax;
      uVar5 = uVar12 & 0x3ffffff;
      *eax = uVar5;
      if ((uVar12 & 0x1f) == 0) {
        return;
      }
      iVar4 = (int)env[-6].mtrr_var[4].base;
      if (iVar4 < 2) {
        return;
      }
      uVar6 = uVar5 + iVar4 * 0x4000000 + 0xfc000000;
      goto LAB_0050c741;
    }
    *eax = 0;
    switch(count) {
    case 0:
      pCVar17 = (env->cache_info_cpuid4).l1d_cache;
      goto LAB_0050c751;
    case 1:
      pCVar17 = (env->cache_info_cpuid4).l1i_cache;
LAB_0050c751:
      iVar9 = (int)env[-6].mtrr_var[4].base;
      iVar4 = 1;
      break;
    case 2:
      pCVar17 = (env->cache_info_cpuid4).l2_cache;
      iVar9 = (int)env[-6].mtrr_var[4].base;
      iVar4 = *(int *)((long)&env[-6].mtrr_var[4].base + 4);
      break;
    case 3:
      uVar12 = apicid_die_offset(&local_48);
      if (*(char *)((long)&env[1].segs[5].base + 2) != '\x01') goto switchD_0050c57f_default;
      pCVar17 = (env->cache_info_cpuid4).l3_cache;
      iVar4 = 1 << ((byte)uVar12 & 0x1f);
      iVar9 = (int)env[-6].mtrr_var[4].base;
      break;
    default:
      goto switchD_0050c57f_default;
    }
    encode_cache_cpuid4(pCVar17,iVar4,iVar9,eax,ebx,ecx,edx);
    break;
  case 5:
    *eax = (uint32_t)env[1].regs[3];
    *ebx = *(uint32_t *)((long)env[1].regs + 0x1c);
    *ecx = (uint32_t)env[1].regs[4];
    uVar12 = *(uint *)((long)env[1].regs + 0x24);
    goto LAB_0050c5a0;
  case 6:
    uVar6 = (uint32_t)env->features[0x14];
LAB_0050c593:
    *eax = uVar6;
    goto LAB_0050c599;
  case 7:
    if (count == 1) {
      uVar6 = (uint32_t)env->features[5];
      goto LAB_0050c593;
    }
    if (count == 0) {
      *eax = env->cpuid_level_func7;
      *ebx = (uint32_t)env->features[2];
      uVar12 = (uint)env->features[3];
      *ecx = uVar12;
      if (((uVar12 & 8) != 0) && ((*(byte *)((long)env->cr + 0x22) & 0x40) != 0)) {
        *ecx = uVar12 | 0x10;
      }
      uVar12 = (uint)env->features[4];
      goto LAB_0050c5a0;
    }
    goto switchD_0050bd38_caseD_80000009;
  case 0xb:
    if (*(char *)((long)&env[1].segs[5].base + 4) != '\0') {
      *ecx = count & 0xff;
      *edx = (uint32_t)env[1].regs[2];
      if (count == 1) {
        *eax = env->pkg_offset;
        *ebx = *(int *)((long)&env[-6].mtrr_var[4].base + 4) * (int)env[-6].mtrr_var[4].base;
        *(byte *)((long)ecx + 1) = *(byte *)((long)ecx + 1) | 2;
      }
      else if (count == 0) {
        uVar12 = apicid_core_offset(&local_48);
        *eax = uVar12;
        *ebx = *(uint32_t *)((long)&env[-6].mtrr_var[4].base + 4);
        *(byte *)((long)ecx + 1) = *(byte *)((long)ecx + 1) | 1;
      }
      else {
        *eax = 0;
        *ebx = 0;
      }
      if (0x1f < *eax) {
        __assert_fail("!(*eax & ~0x1f)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                      ,0x1057,
                      "void cpu_x86_cpuid_x86_64(CPUX86State *, uint32_t, uint32_t, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                     );
      }
LAB_0050c6e3:
      *ebx = (uint)(ushort)*ebx;
      return;
    }
    goto switchD_0050c57f_default;
  case 0xd:
    *eax = 0;
    *ebx = 0;
    *ecx = 0;
    *edx = 0;
    if ((*(byte *)((long)env->features + 0xb) & 4) == 0) {
      return;
    }
    if (count != 1) {
      if (count == 0) {
        puVar11 = &x86_ext_save_areas[0].size;
        uVar14 = 0;
        uVar12 = 0;
        do {
          if ((((env->features[0x16] << 0x20 | env->features[0x15]) >> (uVar14 & 0x3f) & 1) != 0) &&
             (uVar12 <= *puVar11 + puVar11[-1])) {
            uVar12 = *puVar11 + puVar11[-1];
          }
          uVar14 = uVar14 + 1;
          puVar11 = puVar11 + 4;
        } while (uVar14 != 10);
        *ecx = uVar12;
        *eax = (uint32_t)env->features[0x15];
        *edx = (uint32_t)env->features[0x16];
        puVar11 = &x86_ext_save_areas[0].size;
        uVar14 = 0;
        uVar12 = 0;
        do {
          if (((env->xcr0 >> (uVar14 & 0x3f) & 1) != 0) && (uVar12 <= *puVar11 + puVar11[-1])) {
            uVar12 = *puVar11 + puVar11[-1];
          }
          uVar14 = uVar14 + 1;
          puVar11 = puVar11 + 4;
        } while (uVar14 != 10);
        *ebx = uVar12;
        return;
      }
      if (9 < count) {
        return;
      }
      uVar14 = (ulong)count;
      if ((env->features[0x15] >> (uVar14 & 0x3f) & 1) == 0) {
        return;
      }
      uVar6 = x86_ext_save_areas[uVar14].offset;
      *eax = x86_ext_save_areas[uVar14].size;
      *ebx = uVar6;
      return;
    }
    uVar6 = (uint32_t)env->features[0x13];
    goto LAB_0050c741;
  case 0x14:
    *eax = 0;
    *ebx = 0;
    *ecx = 0;
    *edx = 0;
    if ((*(byte *)((long)env->features + 0x13) & 2) != 0) {
      if (count == 1) {
        *eax = 0x2490002;
        *ebx = 0x3f1fff;
      }
      else if (count == 0) {
        *eax = 1;
        *ebx = 0xf;
        *ecx = 7;
      }
    }
    break;
  case 0x1f:
    if (1 < local_48.dies_per_pkg) {
      *ecx = count & 0xff;
      *edx = (uint32_t)env[1].regs[2];
      if (count == 2) {
        *eax = env->pkg_offset;
        *ebx = (int)env[-6].mtrr_var[4].base * env->nr_dies *
               *(int *)((long)&env[-6].mtrr_var[4].base + 4);
        *(byte *)((long)ecx + 1) = *(byte *)((long)ecx + 1) | 5;
      }
      else if (count == 1) {
        uVar12 = apicid_die_offset(&local_48);
        *eax = uVar12;
        *ebx = *(int *)((long)&env[-6].mtrr_var[4].base + 4) * (int)env[-6].mtrr_var[4].base;
        *(byte *)((long)ecx + 1) = *(byte *)((long)ecx + 1) | 2;
      }
      else if (count == 0) {
        uVar12 = apicid_core_offset(&local_48);
        *eax = uVar12;
        *ebx = *(uint32_t *)((long)&env[-6].mtrr_var[4].base + 4);
        *(byte *)((long)ecx + 1) = *(byte *)((long)ecx + 1) | 1;
      }
      else {
        *eax = 0;
        *ebx = 0;
      }
      if (0x1f < *eax) {
        __assert_fail("!(*eax & ~0x1f)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                      ,0x1078,
                      "void cpu_x86_cpuid_x86_64(CPUX86State *, uint32_t, uint32_t, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                     );
      }
      goto LAB_0050c6e3;
    }
switchD_0050c57f_default:
    uVar6 = 0;
    *edx = 0;
    *ecx = 0;
    *ebx = 0;
LAB_0050c741:
    *eax = uVar6;
    break;
  default:
    if ((index == 0x40000000) && (*(char *)((long)env[1].regs + 0xc) == '\x01')) {
      *eax = 0x40000001;
      *ebx = 0x54474354;
      *ecx = 0x43544743;
      *edx = 0x47435447;
      return;
    }
switchD_0050bd38_caseD_80000009:
    *eax = 0;
LAB_0050c599:
    uVar12 = 0;
    *ebx = 0;
    *ecx = 0;
LAB_0050c5a0:
    *edx = uVar12;
    return;
  }
  return;
}

Assistant:

void cpu_x86_cpuid(CPUX86State *env, uint32_t index, uint32_t count,
                   uint32_t *eax, uint32_t *ebx,
                   uint32_t *ecx, uint32_t *edx)
{
    X86CPU *cpu = env_archcpu(env);
    CPUState *cs = env_cpu(env);
    uint32_t die_offset;
    uint32_t limit;
    uint32_t signature[3];
    X86CPUTopoInfo topo_info;

    topo_info.nodes_per_pkg = env->nr_nodes;
    topo_info.dies_per_pkg = env->nr_dies;
    topo_info.cores_per_die = cs->nr_cores;
    topo_info.threads_per_core = cs->nr_threads;

    /* Calculate & apply limits for different index ranges */
    if (index >= 0xC0000000) {
        limit = env->cpuid_xlevel2;
    } else if (index >= 0x80000000) {
        limit = env->cpuid_xlevel;
    } else if (index >= 0x40000000) {
        limit = 0x40000001;
    } else {
        limit = env->cpuid_level;
    }

    if (index > limit) {
        /* Intel documentation states that invalid EAX input will
         * return the same information as EAX=cpuid_level
         * (Intel SDM Vol. 2A - Instruction Set Reference - CPUID)
         */
        index = env->cpuid_level;
    }

    switch(index) {
    case 0:
        *eax = env->cpuid_level;
        *ebx = env->cpuid_vendor1;
        *edx = env->cpuid_vendor2;
        *ecx = env->cpuid_vendor3;
        break;
    case 1:
        *eax = env->cpuid_version;
        *ebx = (cpu->apic_id << 24) |
               8 << 8; /* CLFLUSH size in quad words, Linux wants it. */
        *ecx = env->features[FEAT_1_ECX];
        if ((*ecx & CPUID_EXT_XSAVE) && (env->cr[4] & CR4_OSXSAVE_MASK)) {
            *ecx |= CPUID_EXT_OSXSAVE;
        }
        *edx = env->features[FEAT_1_EDX];
        if (cs->nr_cores * cs->nr_threads > 1) {
            *ebx |= (cs->nr_cores * cs->nr_threads) << 16;
            *edx |= CPUID_HT;
        }
        break;
    case 2:
        /* cache info: needed for Pentium Pro compatibility */
        if (cpu->cache_info_passthrough) {
            host_cpuid(index, 0, eax, ebx, ecx, edx);
            break;
        }
        *eax = 1; /* Number of CPUID[EAX=2] calls required */
        *ebx = 0;
        if (!cpu->enable_l3_cache) {
            *ecx = 0;
        } else {
            *ecx = cpuid2_cache_descriptor(env->cache_info_cpuid2.l3_cache);
        }
        *edx = (cpuid2_cache_descriptor(env->cache_info_cpuid2.l1d_cache) << 16) |
               (cpuid2_cache_descriptor(env->cache_info_cpuid2.l1i_cache) <<  8) |
               (cpuid2_cache_descriptor(env->cache_info_cpuid2.l2_cache));
        break;
    case 4:
        /* cache info: needed for Core compatibility */
        if (cpu->cache_info_passthrough) {
            host_cpuid(index, count, eax, ebx, ecx, edx);
            /* QEMU gives out its own APIC IDs, never pass down bits 31..26.  */
            *eax &= ~0xFC000000;
            if ((*eax & 31) && cs->nr_cores > 1) {
                *eax |= (cs->nr_cores - 1) << 26;
            }
        } else {
            *eax = 0;
            switch (count) {
            case 0: /* L1 dcache info */
                encode_cache_cpuid4(env->cache_info_cpuid4.l1d_cache,
                                    1, cs->nr_cores,
                                    eax, ebx, ecx, edx);
                break;
            case 1: /* L1 icache info */
                encode_cache_cpuid4(env->cache_info_cpuid4.l1i_cache,
                                    1, cs->nr_cores,
                                    eax, ebx, ecx, edx);
                break;
            case 2: /* L2 cache info */
                encode_cache_cpuid4(env->cache_info_cpuid4.l2_cache,
                                    cs->nr_threads, cs->nr_cores,
                                    eax, ebx, ecx, edx);
                break;
            case 3: /* L3 cache info */
                die_offset = apicid_die_offset(&topo_info);
                if (cpu->enable_l3_cache) {
                    encode_cache_cpuid4(env->cache_info_cpuid4.l3_cache,
                                        (1 << die_offset), cs->nr_cores,
                                        eax, ebx, ecx, edx);
                    break;
                }
                /* fall through */
            default: /* end of info */
                *eax = *ebx = *ecx = *edx = 0;
                break;
            }
        }
        break;
    case 5:
        /* MONITOR/MWAIT Leaf */
        *eax = cpu->mwait.eax; /* Smallest monitor-line size in bytes */
        *ebx = cpu->mwait.ebx; /* Largest monitor-line size in bytes */
        *ecx = cpu->mwait.ecx; /* flags */
        *edx = cpu->mwait.edx; /* mwait substates */
        break;
    case 6:
        /* Thermal and Power Leaf */
        *eax = env->features[FEAT_6_EAX];
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        break;
    case 7:
        /* Structured Extended Feature Flags Enumeration Leaf */
        if (count == 0) {
            /* Maximum ECX value for sub-leaves */
            *eax = env->cpuid_level_func7;
            *ebx = env->features[FEAT_7_0_EBX]; /* Feature flags */
            *ecx = env->features[FEAT_7_0_ECX]; /* Feature flags */
            if ((*ecx & CPUID_7_0_ECX_PKU) && env->cr[4] & CR4_PKE_MASK) {
                *ecx |= CPUID_7_0_ECX_OSPKE;
            }
            *edx = env->features[FEAT_7_0_EDX]; /* Feature flags */
        } else if (count == 1) {
            *eax = env->features[FEAT_7_1_EAX];
            *ebx = 0;
            *ecx = 0;
            *edx = 0;
        } else {
            *eax = 0;
            *ebx = 0;
            *ecx = 0;
            *edx = 0;
        }
        break;
    case 9:
        /* Direct Cache Access Information Leaf */
        *eax = 0; /* Bits 0-31 in DCA_CAP MSR */
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        break;
    case 0xA:
        /* Architectural Performance Monitoring Leaf */
        *eax = 0;
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        break;
    case 0xB:
        /* Extended Topology Enumeration Leaf */
        if (!cpu->enable_cpuid_0xb) {
                *eax = *ebx = *ecx = *edx = 0;
                break;
        }

        *ecx = count & 0xff;
        *edx = cpu->apic_id;

        switch (count) {
        case 0:
            *eax = apicid_core_offset(&topo_info);
            *ebx = cs->nr_threads;
            *ecx |= CPUID_TOPOLOGY_LEVEL_SMT;
            break;
        case 1:
            *eax = env->pkg_offset;
            *ebx = cs->nr_cores * cs->nr_threads;
            *ecx |= CPUID_TOPOLOGY_LEVEL_CORE;
            break;
        default:
            *eax = 0;
            *ebx = 0;
            *ecx |= CPUID_TOPOLOGY_LEVEL_INVALID;
        }

        assert(!(*eax & ~0x1f));
        *ebx &= 0xffff; /* The count doesn't need to be reliable. */
        break;
    case 0x1F:
        /* V2 Extended Topology Enumeration Leaf */
        if (env->nr_dies < 2) {
            *eax = *ebx = *ecx = *edx = 0;
            break;
        }

        *ecx = count & 0xff;
        *edx = cpu->apic_id;
        switch (count) {
        case 0:
            *eax = apicid_core_offset(&topo_info);
            *ebx = cs->nr_threads;
            *ecx |= CPUID_TOPOLOGY_LEVEL_SMT;
            break;
        case 1:
            *eax = apicid_die_offset(&topo_info);
            *ebx = cs->nr_cores * cs->nr_threads;
            *ecx |= CPUID_TOPOLOGY_LEVEL_CORE;
            break;
        case 2:
            *eax = env->pkg_offset;
            *ebx = env->nr_dies * cs->nr_cores * cs->nr_threads;
            *ecx |= CPUID_TOPOLOGY_LEVEL_DIE;
            break;
        default:
            *eax = 0;
            *ebx = 0;
            *ecx |= CPUID_TOPOLOGY_LEVEL_INVALID;
        }
        assert(!(*eax & ~0x1f));
        *ebx &= 0xffff; /* The count doesn't need to be reliable. */
        break;
    case 0xD: {
        /* Processor Extended State */
        *eax = 0;
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        if (!(env->features[FEAT_1_ECX] & CPUID_EXT_XSAVE)) {
            break;
        }

        if (count == 0) {
            *ecx = xsave_area_size(x86_cpu_xsave_components(cpu));
            *eax = env->features[FEAT_XSAVE_COMP_LO];
            *edx = env->features[FEAT_XSAVE_COMP_HI];
            /*
             * The initial value of xcr0 and ebx == 0, On host without kvm
             * commit 412a3c41(e.g., CentOS 6), the ebx's value always == 0
             * even through guest update xcr0, this will crash some legacy guest
             * (e.g., CentOS 6), So set ebx == ecx to workaroud it.
             */
            *ebx = xsave_area_size(env->xcr0);
        } else if (count == 1) {
            *eax = env->features[FEAT_XSAVE];
        } else if (count < ARRAY_SIZE(x86_ext_save_areas)) {
            if ((x86_cpu_xsave_components(cpu) >> count) & 1) {
                const ExtSaveArea *esa = &x86_ext_save_areas[count];
                *eax = esa->size;
                *ebx = esa->offset;
            }
        }
        break;
    }
    case 0x14: {
        /* Intel Processor Trace Enumeration */
        *eax = 0;
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        if (!(env->features[FEAT_7_0_EBX] & CPUID_7_0_EBX_INTEL_PT)) {
            break;
        }

        if (count == 0) {
            *eax = INTEL_PT_MAX_SUBLEAF;
            *ebx = INTEL_PT_MINIMAL_EBX;
            *ecx = INTEL_PT_MINIMAL_ECX;
        } else if (count == 1) {
            *eax = INTEL_PT_MTC_BITMAP | INTEL_PT_ADDR_RANGES_NUM;
            *ebx = INTEL_PT_PSB_BITMAP | INTEL_PT_CYCLE_BITMAP;
        }
        break;
    }
    case 0x40000000:
        /*
         * CPUID code in kvm_arch_init_vcpu() ignores stuff
         * set here, but we restrict to TCG none the less.
         */
        if (cpu->expose_tcg) {
            memcpy(signature, "TCGTCGTCGTCG", 12);
            *eax = 0x40000001;
            *ebx = signature[0];
            *ecx = signature[1];
            *edx = signature[2];
        } else {
            *eax = 0;
            *ebx = 0;
            *ecx = 0;
            *edx = 0;
        }
        break;
    case 0x40000001:
        *eax = 0;
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        break;
    case 0x80000000:
        *eax = env->cpuid_xlevel;
        *ebx = env->cpuid_vendor1;
        *edx = env->cpuid_vendor2;
        *ecx = env->cpuid_vendor3;
        break;
    case 0x80000001:
        *eax = env->cpuid_version;
        *ebx = 0;
        *ecx = env->features[FEAT_8000_0001_ECX];
        *edx = env->features[FEAT_8000_0001_EDX];

        /* The Linux kernel checks for the CMPLegacy bit and
         * discards multiple thread information if it is set.
         * So don't set it here for Intel to make Linux guests happy.
         */
        if (cs->nr_cores * cs->nr_threads > 1) {
            if (env->cpuid_vendor1 != CPUID_VENDOR_INTEL_1 ||
                env->cpuid_vendor2 != CPUID_VENDOR_INTEL_2 ||
                env->cpuid_vendor3 != CPUID_VENDOR_INTEL_3) {
                *ecx |= 1 << 1;    /* CmpLegacy bit */
            }
        }
        break;
    case 0x80000002:
    case 0x80000003:
    case 0x80000004:
        *eax = env->cpuid_model[(index - 0x80000002) * 4 + 0];
        *ebx = env->cpuid_model[(index - 0x80000002) * 4 + 1];
        *ecx = env->cpuid_model[(index - 0x80000002) * 4 + 2];
        *edx = env->cpuid_model[(index - 0x80000002) * 4 + 3];
        break;
    case 0x80000005:
        /* cache info (L1 cache) */
        if (cpu->cache_info_passthrough) {
            host_cpuid(index, 0, eax, ebx, ecx, edx);
            break;
        }
        *eax = (L1_DTLB_2M_ASSOC << 24) | (L1_DTLB_2M_ENTRIES << 16) | \
               (L1_ITLB_2M_ASSOC <<  8) | (L1_ITLB_2M_ENTRIES);
        *ebx = (L1_DTLB_4K_ASSOC << 24) | (L1_DTLB_4K_ENTRIES << 16) | \
               (L1_ITLB_4K_ASSOC <<  8) | (L1_ITLB_4K_ENTRIES);
        *ecx = encode_cache_cpuid80000005(env->cache_info_amd.l1d_cache);
        *edx = encode_cache_cpuid80000005(env->cache_info_amd.l1i_cache);
        break;
    case 0x80000006:
        /* cache info (L2 cache) */
        if (cpu->cache_info_passthrough) {
            host_cpuid(index, 0, eax, ebx, ecx, edx);
            break;
        }
        *eax = (AMD_ENC_ASSOC(L2_DTLB_2M_ASSOC) << 28) | \
               (L2_DTLB_2M_ENTRIES << 16) | \
               (AMD_ENC_ASSOC(L2_ITLB_2M_ASSOC) << 12) | \
               (L2_ITLB_2M_ENTRIES);
        *ebx = (AMD_ENC_ASSOC(L2_DTLB_4K_ASSOC) << 28) | \
               (L2_DTLB_4K_ENTRIES << 16) | \
               (AMD_ENC_ASSOC(L2_ITLB_4K_ASSOC) << 12) | \
               (L2_ITLB_4K_ENTRIES);
        encode_cache_cpuid80000006(env->cache_info_amd.l2_cache,
                                   cpu->enable_l3_cache ?
                                   env->cache_info_amd.l3_cache : NULL,
                                   ecx, edx);
        break;
    case 0x80000007:
        *eax = 0;
        *ebx = 0;
        *ecx = 0;
        *edx = env->features[FEAT_8000_0007_EDX];
        break;
    case 0x80000008:
        /* virtual & phys address size in low 2 bytes. */
        if (env->features[FEAT_8000_0001_EDX] & CPUID_EXT2_LM) {
            /* 64 bit processor */
            *eax = cpu->phys_bits; /* configurable physical bits */
            if  (env->features[FEAT_7_0_ECX] & CPUID_7_0_ECX_LA57) {
                *eax |= 0x00003900; /* 57 bits virtual */
            } else {
                *eax |= 0x00003000; /* 48 bits virtual */
            }
        } else {
            *eax = cpu->phys_bits;
        }
        *ebx = env->features[FEAT_8000_0008_EBX];
        *ecx = 0;
        *edx = 0;
        if (cs->nr_cores * cs->nr_threads > 1) {
            *ecx |= (cs->nr_cores * cs->nr_threads) - 1;
        }
        break;
    case 0x8000000A:
        if (env->features[FEAT_8000_0001_ECX] & CPUID_EXT3_SVM) {
            *eax = 0x00000001; /* SVM Revision */
            *ebx = 0x00000010; /* nr of ASIDs */
            *ecx = 0;
            *edx = env->features[FEAT_SVM]; /* optional features */
        } else {
            *eax = 0;
            *ebx = 0;
            *ecx = 0;
            *edx = 0;
        }
        break;
    case 0x8000001D:
        *eax = 0;
        if (cpu->cache_info_passthrough) {
            host_cpuid(index, count, eax, ebx, ecx, edx);
            break;
        }
        switch (count) {
        case 0: /* L1 dcache info */
            encode_cache_cpuid8000001d(env->cache_info_amd.l1d_cache,
                                       &topo_info, eax, ebx, ecx, edx);
            break;
        case 1: /* L1 icache info */
            encode_cache_cpuid8000001d(env->cache_info_amd.l1i_cache,
                                       &topo_info, eax, ebx, ecx, edx);
            break;
        case 2: /* L2 cache info */
            encode_cache_cpuid8000001d(env->cache_info_amd.l2_cache,
                                       &topo_info, eax, ebx, ecx, edx);
            break;
        case 3: /* L3 cache info */
            encode_cache_cpuid8000001d(env->cache_info_amd.l3_cache,
                                       &topo_info, eax, ebx, ecx, edx);
            break;
        default: /* end of info */
            *eax = *ebx = *ecx = *edx = 0;
            break;
        }
        break;
    case 0x8000001E:
        assert(cpu->core_id <= 255);
        encode_topo_cpuid8000001e(&topo_info, cpu, eax, ebx, ecx, edx);
        break;
    case 0xC0000000:
        *eax = env->cpuid_xlevel2;
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        break;
    case 0xC0000001:
        /* Support for VIA CPU's CPUID instruction */
        *eax = env->cpuid_version;
        *ebx = 0;
        *ecx = 0;
        *edx = env->features[FEAT_C000_0001_EDX];
        break;
    case 0xC0000002:
    case 0xC0000003:
    case 0xC0000004:
        /* Reserved for the future, and now filled with zero */
        *eax = 0;
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        break;
    default:
        /* reserved values: zero */
        *eax = 0;
        *ebx = 0;
        *ecx = 0;
        *edx = 0;
        break;
    }
}